

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

void Nf_StoCreateGateAdd(Vec_Mem_t *vTtMem,Vec_Wec_t *vTt2Match,Mio_Cell2_t *pCell,word uTruth,
                        int *pFans,int nFans,Vec_Wec_t *vProfs,Vec_Int_t *vStore,int fPinFilter,
                        int fPinPerm,int fPinQuick)

{
  int iVar1;
  Nf_Cfg_t NVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Vec_Int_t *p;
  int *pProf_00;
  ulong local_98;
  int *pProf;
  int Offset;
  Nf_Cfg_t local_70;
  Nf_Cfg_t Mat;
  int iFunc;
  word uFunc;
  int fCompl;
  int Entry;
  int GateId;
  int k;
  int i;
  Vec_Int_t *vArrayProfs;
  Vec_Int_t *vArray;
  int nFans_local;
  int *pFans_local;
  word uTruth_local;
  Mio_Cell2_t *pCell_local;
  Vec_Wec_t *vTt2Match_local;
  Vec_Mem_t *vTtMem_local;
  
  _k = (Vec_Int_t *)0x0;
  local_98 = uTruth;
  if ((uTruth & 1) != 0) {
    local_98 = uTruth ^ 0xffffffffffffffff;
  }
  _Mat = local_98;
  iVar1 = Vec_MemHashInsert(vTtMem,(word *)&Mat);
  NVar2 = Nf_Int2Cfg(0);
  iVar3 = Vec_WecSize(vTt2Match);
  if (iVar1 == iVar3) {
    Vec_WecPushLevel(vTt2Match);
  }
  p = Vec_WecEntry(vTt2Match,iVar1);
  local_70 = (Nf_Cfg_t)((uint)NVar2 & 0xfffffffe | (uint)uTruth & 1);
  if (nFans != *(uint *)&pCell->field_0x10 >> 0x1c) {
    __assert_fail("nFans == (int)pCell->nFanins",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                  ,0xc3,
                  "void Nf_StoCreateGateAdd(Vec_Mem_t *, Vec_Wec_t *, Mio_Cell2_t *, word, int *, int, Vec_Wec_t *, Vec_Int_t *, int, int, int)"
                 );
  }
  for (GateId = 0; GateId < nFans; GateId = GateId + 1) {
    iVar3 = Abc_Lit2Var(pFans[GateId]);
    iVar4 = Abc_LitIsCompl(pFans[GateId]);
    iVar5 = Abc_Lit2Var(pFans[GateId]);
    local_70 = (Nf_Cfg_t)
               ((uint)local_70 & 1 |
                ((uint)local_70 >> 8 | GateId << ((byte)(iVar3 << 2) & 0x1f)) << 8 |
               (((uint)local_70 & 0xfe) >> 1 | iVar4 << ((byte)iVar5 & 0x1f) & 0x7fU) << 1);
  }
  if (fPinFilter != 0) {
    iVar3 = Vec_WecSize(vTt2Match);
    iVar4 = Vec_WecSize(vProfs);
    if (iVar3 != iVar4) {
      __assert_fail("Vec_WecSize(vTt2Match) == Vec_WecSize(vProfs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                    ,0xcd,
                    "void Nf_StoCreateGateAdd(Vec_Mem_t *, Vec_Wec_t *, Mio_Cell2_t *, word, int *, int, Vec_Wec_t *, Vec_Int_t *, int, int, int)"
                   );
    }
    iVar3 = Vec_WecSize(vProfs);
    if (iVar1 == iVar3) {
      Vec_WecPushLevel(vProfs);
    }
    _k = Vec_WecEntry(vProfs,iVar1);
    iVar1 = Vec_IntSize(p);
    iVar3 = Vec_IntSize(_k);
    if (iVar1 != iVar3 * 2) {
      __assert_fail("Vec_IntSize(vArray) == 2 * Vec_IntSize(vArrayProfs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                    ,0xd1,
                    "void Nf_StoCreateGateAdd(Vec_Mem_t *, Vec_Wec_t *, Mio_Cell2_t *, word, int *, int, Vec_Wec_t *, Vec_Int_t *, int, int, int)"
                   );
    }
    for (GateId = 0; iVar1 = Vec_IntSize(p), GateId + 1 < iVar1; GateId = GateId + 2) {
      Vec_IntEntry(p,GateId);
      iVar1 = Vec_IntEntry(p,GateId + 1);
      NVar2 = Nf_Int2Cfg(iVar1);
      if ((((uint)NVar2 >> 1 & 0x7f) == ((uint)local_70 >> 1 & 0x7f)) &&
         (NVar2 = Nf_Int2Cfg(iVar1), ((uint)NVar2 & 1) == ((uint)local_70 & 1))) {
        iVar1 = Vec_IntEntry(_k,GateId / 2);
        pProf_00 = Vec_IntEntryP(vStore,iVar1);
        iVar1 = Nf_StoCellIsDominated(pCell,pFans,pProf_00);
        if (iVar1 != 0) {
          return;
        }
      }
    }
  }
  if (fPinPerm == 0) {
    if (fPinQuick == 0) {
      for (GateId = 0; iVar1 = Vec_IntSize(p), GateId + 1 < iVar1; GateId = GateId + 2) {
        uVar6 = Vec_IntEntry(p,GateId);
        iVar1 = Vec_IntEntry(p,GateId + 1);
        if ((uVar6 == (*(uint *)&pCell->field_0x10 & 0x3ffffff)) &&
           (NVar2 = Nf_Int2Cfg(iVar1), ((uint)NVar2 >> 1 & 0x7f) == ((uint)local_70 >> 1 & 0x7f))) {
          return;
        }
      }
    }
    else {
      for (GateId = 0; iVar1 = Vec_IntSize(p), GateId + 1 < iVar1; GateId = GateId + 2) {
        uVar6 = Vec_IntEntry(p,GateId);
        iVar1 = Vec_IntEntry(p,GateId + 1);
        if ((uVar6 == (*(uint *)&pCell->field_0x10 & 0x3ffffff)) &&
           (NVar2 = Nf_Int2Cfg(iVar1),
           Abc_TtBitCount8[(uint)NVar2 >> 1 & 0x7f] == Abc_TtBitCount8[(uint)local_70 >> 1 & 0x7f]))
        {
          return;
        }
      }
    }
  }
  Vec_IntPush(p,*(uint *)&pCell->field_0x10 & 0x3ffffff);
  iVar1 = Nf_Cfg2Int(local_70);
  Vec_IntPush(p,iVar1);
  if (fPinFilter != 0) {
    iVar1 = Vec_IntSize(vStore);
    Vec_IntPush(_k,iVar1);
    iVar1 = Abc_Float2Int(pCell->AreaF);
    Vec_IntPush(vStore,iVar1);
    for (Entry = 0; Entry < nFans; Entry = Entry + 1) {
      iVar1 = Abc_Lit2Var(pFans[Entry]);
      Vec_IntPush(vStore,pCell->iDelays[iVar1]);
    }
  }
  return;
}

Assistant:

void Nf_StoCreateGateAdd( Vec_Mem_t * vTtMem, Vec_Wec_t * vTt2Match, Mio_Cell2_t * pCell, word uTruth, int * pFans, int nFans, Vec_Wec_t * vProfs, Vec_Int_t * vStore, int fPinFilter, int fPinPerm, int fPinQuick )
{
    Vec_Int_t * vArray, * vArrayProfs = NULL;
    int i, k, GateId, Entry, fCompl = (int)(uTruth & 1);
    word uFunc = fCompl ? ~uTruth : uTruth;
    int iFunc = Vec_MemHashInsert( vTtMem, &uFunc );
    Nf_Cfg_t Mat = Nf_Int2Cfg(0);
    // get match array
    if ( iFunc == Vec_WecSize(vTt2Match) )
        Vec_WecPushLevel( vTt2Match );
    vArray = Vec_WecEntry( vTt2Match, iFunc );
    // create match
    Mat.fCompl = fCompl;
    assert( nFans == (int)pCell->nFanins );
    for ( i = 0; i < nFans; i++ )
    {
        Mat.Perm  |= (unsigned)(i << (Abc_Lit2Var(pFans[i]) << 2));
        Mat.Phase |= (unsigned)(Abc_LitIsCompl(pFans[i]) << Abc_Lit2Var(pFans[i]));
    }
    // check other profiles
    if ( fPinFilter )
    {
        // get profile array
        assert( Vec_WecSize(vTt2Match) == Vec_WecSize(vProfs) );
        if ( iFunc == Vec_WecSize(vProfs) )
            Vec_WecPushLevel( vProfs );
        vArrayProfs = Vec_WecEntry( vProfs, iFunc );
        assert( Vec_IntSize(vArray) == 2 * Vec_IntSize(vArrayProfs) );
        // skip dominated matches
        Vec_IntForEachEntryDouble( vArray, GateId, Entry, i )
            if ( Nf_Int2Cfg(Entry).Phase == Mat.Phase && Nf_Int2Cfg(Entry).fCompl == Mat.fCompl )
            {
                int Offset = Vec_IntEntry(vArrayProfs, i/2);
                int * pProf = Vec_IntEntryP(vStore, Offset);
                if ( Nf_StoCellIsDominated(pCell, pFans, pProf) )
                    return;
            }
    }
    // check pin permutation
    if ( !fPinPerm ) // do not use  pin-permutation (improves delay when pin-delays differ)
    {
        if ( fPinQuick ) // reduce the number of matches agressively
        {
            Vec_IntForEachEntryDouble( vArray, GateId, Entry, i )
                if ( GateId == (int)pCell->Id && Abc_TtBitCount8[Nf_Int2Cfg(Entry).Phase] == Abc_TtBitCount8[Mat.Phase] )
                    return;
        }
        else // reduce the number of matches less agressively
        {
            Vec_IntForEachEntryDouble( vArray, GateId, Entry, i )
                if ( GateId == (int)pCell->Id && Nf_Int2Cfg(Entry).Phase == Mat.Phase )
                    return;
        }
    }
    // save data and profile
    Vec_IntPush( vArray, pCell->Id );
    Vec_IntPush( vArray, Nf_Cfg2Int(Mat) );
    // add delay profile
    if ( fPinFilter )
    {
        Vec_IntPush( vArrayProfs, Vec_IntSize(vStore) );
        Vec_IntPush( vStore, Abc_Float2Int(pCell->AreaF) );
        for ( k = 0; k < nFans; k++ )
            Vec_IntPush( vStore, pCell->iDelays[Abc_Lit2Var(pFans[k])] );
    }
}